

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O1

void __thiscall TTD::SnapshotExtractor::MarkVisitType(SnapshotExtractor *this,Type *type)

{
  RecyclableObject *var;
  bool bVar1;
  
  bVar1 = MarkTable::MarkAndTestAddr<(TTD::MarkTableTag)2>(&this->m_marks,type);
  if (bVar1) {
    bVar1 = Js::DynamicType::Is(type->typeId);
    if (bVar1) {
      MarkTable::MarkAndTestAddr<(TTD::MarkTableTag)1>(&this->m_marks,*(void **)(type + 1));
    }
    var = (type->prototype).ptr;
    if (var != (RecyclableObject *)0x0) {
      MarkVisitVar(this,var);
      return;
    }
  }
  return;
}

Assistant:

void SnapshotExtractor::MarkVisitType(Js::Type* type)
    {
        //Must ensure this is de-serialized before you call this

        if(this->m_marks.MarkAndTestAddr<MarkTableTag::TypeTag>(type))
        {
            if(Js::DynamicType::Is(type))
            {
                Js::DynamicTypeHandler* handler = (static_cast<Js::DynamicType*>(type))->GetTypeHandler();

                this->MarkVisitHandler(handler);
            }

            Js::RecyclableObject* proto = type->GetPrototype();
            if(proto != nullptr)
            {
                this->MarkVisitVar(proto);
            }
        }
    }